

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffobjs.c
# Opt level: O0

void remove_subset_prefix(FT_String *name)

{
  bool bVar1;
  size_t sVar2;
  int local_18;
  int iStack_14;
  FT_Bool continue_search;
  FT_Int32 length;
  FT_Int32 idx;
  FT_String *name_local;
  
  sVar2 = strlen(name);
  local_18 = (int)sVar2 + 1;
  bVar1 = true;
  while (bVar1) {
    if ((local_18 < 7) || (name[6] != '+')) {
      bVar1 = false;
    }
    else {
      for (iStack_14 = 0; iStack_14 < 6; iStack_14 = iStack_14 + 1) {
        if ((name[iStack_14] < 'A') || ('Z' < name[iStack_14])) {
          bVar1 = false;
        }
      }
      if (bVar1) {
        for (iStack_14 = 7; iStack_14 < local_18; iStack_14 = iStack_14 + 1) {
          name[iStack_14 + -7] = name[iStack_14];
        }
        local_18 = local_18 + -7;
      }
    }
  }
  return;
}

Assistant:

static void
  remove_subset_prefix( FT_String*  name )
  {
    FT_Int32  idx             = 0;
    FT_Int32  length          = (FT_Int32)ft_strlen( name ) + 1;
    FT_Bool   continue_search = 1;


    while ( continue_search )
    {
      if ( length >= 7 && name[6] == '+' )
      {
        for ( idx = 0; idx < 6; idx++ )
        {
          /* ASCII uppercase letters */
          if ( !( 'A' <= name[idx] && name[idx] <= 'Z' ) )
            continue_search = 0;
        }

        if ( continue_search )
        {
          for ( idx = 7; idx < length; idx++ )
            name[idx - 7] = name[idx];
          length -= 7;
        }
      }
      else
        continue_search = 0;
    }
  }